

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_numberK(FuncState *fs,lua_Number r)

{
  int iVar1;
  int iVar2;
  TValue *io;
  double dVar3;
  TValue o;
  TValue kv;
  lua_Integer ik;
  
  o.tt_ = '\x13';
  o.value_.n = r;
  if ((r != 0.0) || (NAN(r))) {
    dVar3 = ldexp(1.0,-0x34);
    kv.value_.n = (dVar3 + 1.0) * r;
    kv.tt_ = '\x13';
    iVar1 = luaV_flttointeger(kv.value_.n,&ik,F2Ieq);
    if (iVar1 == 0) {
      iVar1 = k2proto(fs,&kv,&o);
      iVar2 = luaV_equalobj((lua_State *)0x0,fs->f->k + iVar1,&o);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    iVar1 = addk(fs,fs->f,&o);
  }
  else {
    kv.tt_ = '\x02';
    kv.value_ = (Value)fs;
    iVar1 = k2proto(fs,&kv,&o);
  }
  return iVar1;
}

Assistant:

static int luaK_numberK (FuncState *fs, lua_Number r) {
  TValue o, kv;
  setfltvalue(&o, r);  /* value as a TValue */
  if (r == 0) {  /* handle zero as a special case */
    setpvalue(&kv, fs);  /* use FuncState as index */
    return k2proto(fs, &kv, &o);  /* cannot collide */
  }
  else {
    const int nbm = l_floatatt(MANT_DIG);
    const lua_Number q = l_mathop(ldexp)(l_mathop(1.0), -nbm + 1);
    const lua_Number k =  r * (1 + q);  /* key */
    lua_Integer ik;
    setfltvalue(&kv, k);  /* key as a TValue */
    if (!luaV_flttointeger(k, &ik, F2Ieq)) {  /* not an integral value? */
      int n = k2proto(fs, &kv, &o);  /* use key */
      if (luaV_rawequalobj(&fs->f->k[n], &o))  /* correct value? */
        return n;
    }
    /* else, either key is still an integer or there was a collision;
       anyway, do not try to reuse constant; instead, create a new one */
    return addk(fs, fs->f, &o);
  }
}